

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextodfwriter.cpp
# Opt level: O1

void __thiscall
QTextOdfWriter::writeFormats(QTextOdfWriter *this,QXmlStreamWriter *writer,QSet<int> *formats)

{
  int iVar1;
  char16_t *pcVar2;
  ulong uVar3;
  int iVar4;
  QTextFormat *this_00;
  QArrayDataPointer<QTextFormat> *pQVar5;
  QList<QTextFormat> *in_R9;
  Data *pDVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  QAnyStringView QVar9;
  QAnyStringView QVar10;
  QTextBlockFormat format;
  QTextListFormat format_00;
  QTextTableCellFormat format_01;
  QTextTableFormat format_02;
  QTextCharFormat format_03;
  QTextFrameFormat format_04;
  QArrayDataPointer<QTextFormat> local_c8;
  QTextFormat local_a8;
  QTextFormat local_98;
  QTextFormat local_88;
  QTextFormat local_78;
  QTextFormat local_68;
  QTextFormat local_58;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar2 = (this->officeNS).d.ptr;
  uVar3 = (this->officeNS).d.size;
  QVar8.m_data = (storage_type *)0x10;
  QVar8.m_size = (qsizetype)&local_c8;
  QString::fromLatin1(QVar8);
  QVar9.m_size = (size_t)pcVar2;
  QVar9.field_0.m_data_utf8 = (char *)writer;
  QVar10.m_size = (size_t)local_c8.ptr;
  QVar10.field_0.m_data = (void *)(uVar3 | 0x8000000000000000);
  QXmlStreamWriter::writeStartElement(QVar9,QVar10);
  pQVar5 = (QArrayDataPointer<QTextFormat> *)local_c8.size;
  if (&(local_c8.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d)->super_QArrayData,2,0x10);
      pQVar5 = (QArrayDataPointer<QTextFormat> *)local_c8.size;
    }
  }
  local_c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.ptr = (QTextFormat *)&DAT_aaaaaaaaaaaaaaaa;
  QTextDocument::allFormats((QList<QTextFormat> *)&local_c8,this->m_document);
  pDVar6 = (formats->q_hash).d;
  if (pDVar6 == (Data *)0x0) {
    pDVar6 = (Data *)0x0;
  }
  else if (pDVar6->spans->offsets[0] == 0xff) {
    uVar3 = 1;
    do {
      uVar7 = uVar3;
      if (pDVar6->numBuckets == uVar7) {
        pDVar6 = (Data *)0x0;
        uVar7 = 0;
        break;
      }
      uVar3 = uVar7 + 1;
    } while (pDVar6->spans[uVar7 >> 7].offsets[(uint)uVar7 & 0x7f] == 0xff);
    goto LAB_005c3b28;
  }
  uVar7 = 0;
LAB_005c3b28:
  if (pDVar6 != (Data *)0x0 || uVar7 != 0) {
    do {
      iVar1 = *(int *)pDVar6->spans[uVar7 >> 7].entries
                      [pDVar6->spans[uVar7 >> 7].offsets[(uint)uVar7 & 0x7f]].storage.data;
      local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextFormat::QTextFormat((QTextFormat *)local_48,local_c8.ptr + iVar1);
      iVar4 = QTextFormat::type((QTextFormat *)local_48);
      switch(iVar4) {
      case 1:
        this_00 = &local_78;
        QTextFormat::toBlockFormat(this_00);
        format.super_QTextFormat.format_type = iVar1;
        format.super_QTextFormat.d.d.ptr =
             (totally_ordered_wrapper<QTextFormatPrivate_*>)
             (totally_ordered_wrapper<QTextFormatPrivate_*>)this_00;
        format.super_QTextFormat._12_4_ = 0;
        writeBlockFormat(this,writer,format,(int)pQVar5);
        break;
      case 2:
        iVar4 = QTextFormat::type((QTextFormat *)local_48);
        if ((iVar4 == 2) &&
           (iVar4 = QTextFormat::intProperty((QTextFormat *)local_48,0x2f00), iVar4 == 3)) {
          this_00 = &local_58;
          QTextFormat::toTableCellFormat(this_00);
          pQVar5 = &local_c8;
          format_01.super_QTextCharFormat.super_QTextFormat.format_type = iVar1;
          format_01.super_QTextCharFormat.super_QTextFormat.d.d.ptr =
               (totally_ordered_wrapper<QTextFormatPrivate_*>)
               (totally_ordered_wrapper<QTextFormatPrivate_*>)this_00;
          format_01.super_QTextCharFormat.super_QTextFormat._12_4_ = 0;
          writeTableCellFormat(this,writer,format_01,(int)pQVar5,in_R9);
        }
        else {
          this_00 = &local_68;
          QTextFormat::toCharFormat(this_00);
          format_03.super_QTextFormat.format_type = iVar1;
          format_03.super_QTextFormat.d.d.ptr =
               (totally_ordered_wrapper<QTextFormatPrivate_*>)
               (totally_ordered_wrapper<QTextFormatPrivate_*>)this_00;
          format_03.super_QTextFormat._12_4_ = 0;
          writeCharacterFormat(this,writer,format_03,(int)pQVar5);
        }
        break;
      case 3:
        this_00 = &local_88;
        QTextFormat::toListFormat(this_00);
        format_00.super_QTextFormat.format_type = iVar1;
        format_00.super_QTextFormat.d.d.ptr =
             (totally_ordered_wrapper<QTextFormatPrivate_*>)
             (totally_ordered_wrapper<QTextFormatPrivate_*>)this_00;
        format_00.super_QTextFormat._12_4_ = 0;
        writeListFormat(this,writer,format_00,(int)pQVar5);
        break;
      default:
        goto switchD_005c3bae_caseD_4;
      case 5:
        iVar4 = QTextFormat::type((QTextFormat *)local_48);
        if ((iVar4 == 5) &&
           (iVar4 = QTextFormat::intProperty((QTextFormat *)local_48,0x2f00), iVar4 == 2)) {
          this_00 = &local_98;
          QTextFormat::toTableFormat(this_00);
          format_02.super_QTextFrameFormat.super_QTextFormat.format_type = iVar1;
          format_02.super_QTextFrameFormat.super_QTextFormat.d.d.ptr =
               (totally_ordered_wrapper<QTextFormatPrivate_*>)
               (totally_ordered_wrapper<QTextFormatPrivate_*>)this_00;
          format_02.super_QTextFrameFormat.super_QTextFormat._12_4_ = 0;
          writeTableFormat(this,writer,format_02,(int)pQVar5);
        }
        else {
          this_00 = &local_a8;
          QTextFormat::toFrameFormat(this_00);
          format_04.super_QTextFormat.format_type = iVar1;
          format_04.super_QTextFormat.d.d.ptr =
               (totally_ordered_wrapper<QTextFormatPrivate_*>)
               (totally_ordered_wrapper<QTextFormatPrivate_*>)this_00;
          format_04.super_QTextFormat._12_4_ = 0;
          writeFrameFormat(this,writer,format_04,(int)pQVar5);
        }
      }
      QTextFormat::~QTextFormat(this_00);
switchD_005c3bae_caseD_4:
      QTextFormat::~QTextFormat((QTextFormat *)local_48);
      do {
        if (pDVar6->numBuckets - 1 == uVar7) {
          pDVar6 = (Data *)0x0;
          uVar7 = 0;
          break;
        }
        uVar7 = uVar7 + 1;
      } while (pDVar6->spans[uVar7 >> 7].offsets[(uint)uVar7 & 0x7f] == 0xff);
    } while ((pDVar6 != (Data *)0x0) || (uVar7 != 0));
  }
  QXmlStreamWriter::writeEndElement();
  QArrayDataPointer<QTextFormat>::~QArrayDataPointer(&local_c8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextOdfWriter::writeFormats(QXmlStreamWriter &writer, const QSet<int> &formats) const
{
    writer.writeStartElement(officeNS, QString::fromLatin1("automatic-styles"));
    QList<QTextFormat> allStyles = m_document->allFormats();
    for (int formatIndex : formats) {
        QTextFormat textFormat = allStyles.at(formatIndex);
        switch (textFormat.type()) {
        case QTextFormat::CharFormat:
            if (textFormat.isTableCellFormat())
                writeTableCellFormat(writer, textFormat.toTableCellFormat(), formatIndex, allStyles);
            else
                writeCharacterFormat(writer, textFormat.toCharFormat(), formatIndex);
            break;
        case QTextFormat::BlockFormat:
            writeBlockFormat(writer, textFormat.toBlockFormat(), formatIndex);
            break;
        case QTextFormat::ListFormat:
            writeListFormat(writer, textFormat.toListFormat(), formatIndex);
            break;
        case QTextFormat::FrameFormat:
            if (textFormat.isTableFormat())
                writeTableFormat(writer, textFormat.toTableFormat(), formatIndex);
            else
                writeFrameFormat(writer, textFormat.toFrameFormat(), formatIndex);
            break;
        }
    }

    writer.writeEndElement(); // automatic-styles
}